

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O0

void ot::commissioner::DtlsSession::DtlsTimer::SetDelay
               (void *aDtlsTimer,uint32_t aIntermediate,uint32_t aFinish)

{
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tVar1;
  duration<long,_std::ratio<1L,_1000L>_> local_40;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_38 [2];
  Duration local_28;
  void *local_20;
  DtlsTimer *timer;
  uint32_t aFinish_local;
  uint32_t aIntermediate_local;
  void *aDtlsTimer_local;
  
  local_20 = aDtlsTimer;
  timer._0_4_ = aFinish;
  timer._4_4_ = aIntermediate;
  _aFinish_local = aDtlsTimer;
  if (aFinish == 0) {
    *(undefined1 *)((long)aDtlsTimer + 0xb8) = 1;
    Timer::Stop((Timer *)aDtlsTimer);
  }
  else {
    *(undefined1 *)((long)aDtlsTimer + 0xb8) = 0;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<unsigned_int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_28,(uint *)&timer);
    Timer::Start((Timer *)aDtlsTimer,local_28);
    local_38[0].__d.__r = (duration)std::chrono::_V2::system_clock::now();
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<unsigned_int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_40,(uint *)((long)&timer + 4));
    tVar1 = std::chrono::operator+(local_38,&local_40);
    ((duration *)((long)local_20 + 0xb0))->__r = (rep)tVar1.__d.__r;
  }
  return;
}

Assistant:

void DtlsSession::DtlsTimer::SetDelay(void *aDtlsTimer, uint32_t aIntermediate, uint32_t aFinish)
{
    auto timer = reinterpret_cast<DtlsTimer *>(aDtlsTimer);

    if (aFinish == 0)
    {
        timer->mCancelled = true;
        timer->Stop();
    }
    else
    {
        timer->mCancelled = false;
        timer->Start(std::chrono::milliseconds(aFinish));
        timer->mIntermediate = Clock::now() + std::chrono::milliseconds(aIntermediate);
    }
}